

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::lookAt(Matrix4f *__return_storage_ptr__,Vector3f *eye,Vector3f *center,Vector3f *up)

{
  float fVar1;
  Vector4f local_64;
  Vector3f x;
  Vector3f y;
  Vector3f z;
  
  operator-(eye,center);
  Vector3f::normalized((Vector3f *)&local_64);
  Vector3f::Vector3f(&y,up);
  Vector3f::cross(&y,&z);
  Matrix4f(__return_storage_ptr__,0.0);
  fVar1 = Vector3f::dot(&x,eye);
  Vector4f::Vector4f(&local_64,&x,-fVar1);
  setRow(__return_storage_ptr__,0,&local_64);
  fVar1 = Vector3f::dot(&y,eye);
  Vector4f::Vector4f(&local_64,&y,-fVar1);
  setRow(__return_storage_ptr__,1,&local_64);
  fVar1 = Vector3f::dot(&z,eye);
  Vector4f::Vector4f(&local_64,&z,-fVar1);
  setRow(__return_storage_ptr__,2,&local_64);
  Vector4f::Vector4f(&local_64,0.0,0.0,0.0,1.0);
  setRow(__return_storage_ptr__,3,&local_64);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::lookAt( const Vector3f& eye, const Vector3f& center, const Vector3f& up )
{
	// z is negative forward
	Vector3f z = ( eye - center ).normalized();
	Vector3f y = up;
	Vector3f x = Vector3f::cross( y, z );

	// the x, y, and z vectors define the orthonormal coordinate system
	// the affine part defines the overall translation
	Matrix4f view;

	view.setRow( 0, Vector4f( x, -Vector3f::dot( x, eye ) ) );
	view.setRow( 1, Vector4f( y, -Vector3f::dot( y, eye ) ) );
	view.setRow( 2, Vector4f( z, -Vector3f::dot( z, eye ) ) );
	view.setRow( 3, Vector4f( 0, 0, 0, 1 ) );

	return view;
}